

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int ac,char **av)

{
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<int,_char> *ptVar5;
  typed_value<double,_char> *ptVar6;
  const_iterator cVar7;
  long *plVar8;
  time_duration_type tVar9;
  ostream *poVar10;
  dataset_t *this;
  mscomplex_t *pmVar11;
  int comp_no;
  timer t;
  mscomplex_ptr_t msc;
  dataset_ptr_t ds;
  tri_idx_list_t tlist;
  double simp_tresh;
  fn_list_t fns;
  string off_filename;
  string bin_filename;
  string tri_filename;
  string simp_method;
  required_option e;
  options_description desc;
  variables_map vm;
  int local_374;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  timer local_350;
  shared_ptr<trimesh::mscomplex_t> local_348;
  shared_ptr<trimesh::dataset_t> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  double local_300;
  vector<double,_std::allocator<double>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  dataset_ptr_t local_280;
  dataset_ptr_t local_270;
  mscomplex_ptr_t local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [184];
  undefined1 *local_178 [2];
  undefined1 local_168 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_150 [24];
  void *local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  undefined8 local_118;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_110 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f8;
  undefined1 local_d0 [24];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_374 = 0;
  local_300 = 0.0;
  local_230._0_8_ = local_230 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_178,(string *)local_230,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_);
  }
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_2f8,"help,h");
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&local_2a0);
  local_230._0_8_ = local_230 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"");
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_230);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"tri-file,t",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&local_2c0);
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"bin-file,b",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&local_2e0);
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"");
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_370);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"off-file,o",(char *)ptVar4);
  ptVar5 = boost::program_options::value<int>(&local_374);
  local_348.px._0_4_ = 0;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,(int *)&local_348);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"comp-no,c",(char *)ptVar5);
  ptVar6 = boost::program_options::value<double>(&local_300);
  local_338.px = (dataset_t *)0x0;
  ptVar6 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar6,(double *)&local_338);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"simp-tresh,s",(char *)ptVar6);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&local_250);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"P","");
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_328);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"simp-method",(char *)ptVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  pcVar1 = local_230 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((pointer)local_230._0_8_ != pcVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  local_f8.super_function_base.vtable = (vtable_base *)0x0;
  local_f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_f8.super_function_base.functor._8_8_ = 0;
  local_f8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_230,ac,av,(options_description *)local_178,0,
             &local_f8);
  boost::program_options::store((basic_parsed_options *)local_230,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_230);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_f8);
  local_230._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"help","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)(local_d0 + 0x10),(key_type *)local_230);
  if ((pointer)local_230._0_8_ != pcVar1) {
    operator_delete((void *)local_230._0_8_);
  }
  if (cVar7._M_node != &local_b8) {
    plVar8 = (long *)boost::program_options::operator<<
                               ((ostream *)&std::cout,(options_description *)local_178);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    iVar2 = 0;
    std::ostream::flush();
    goto LAB_0014b9f5;
  }
  boost::program_options::notify((variables_map *)local_d0);
  if ((local_2c0._M_string_length == 0 || local_2a0._M_string_length == 0) &&
     (local_2e0._M_string_length == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Must specify either tri-bin or off file",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    plVar8 = (long *)boost::program_options::operator<<
                               ((ostream *)&std::cout,(options_description *)local_178);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    iVar2 = 1;
    std::ostream::flush();
    goto LAB_0014b9f5;
  }
  utl::timer::timer(&local_350);
  local_350._start_time =
       boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                 (boost::date_time::c_time::localtime);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"====================================",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"         Starting Processing        ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------------------",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  local_328._M_dataplus._M_p = (pointer)0x0;
  local_328._M_string_length = 0;
  local_328.field_2._M_allocated_capacity = 0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"selected comp = ",0x10);
  plVar8 = (long *)std::ostream::operator<<(&std::cout,local_374);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------------------",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  local_230._8_8_ = (pointer)0x0;
  local_230[0x10] = '\0';
  if (local_2e0._M_string_length == 0) {
    local_230._0_8_ = pcVar1;
    print_bin_info(&local_2c0);
    read_tri_tlist(local_2a0._M_dataplus._M_p,(tri_idx_list_t *)&local_328);
    read_bin_file<double>(&local_2f8,&local_2c0,local_374);
  }
  else {
    local_230._0_8_ = pcVar1;
    read_off_file<double>(&local_2e0,&local_2f8,(tri_idx_list_t *)&local_328,local_374);
  }
  std::__cxx11::string::_M_assign((string *)local_230);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"data read ---------------- ",0x1b);
  local_370._M_dataplus._M_p =
       (pointer)boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                          (boost::date_time::c_time::localtime);
  tVar9 = boost::date_time::
          counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
          ::subtract_times((time_rep_type *)&local_370,(time_rep_type *)&local_350);
  poVar10 = std::ostream::_M_insert<double>
                      ((double)((long)tVar9.
                                      super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                      .ticks_.value_ / 1000) / 1000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  this = (dataset_t *)operator_new(0x60);
  trimesh::dataset_t::dataset_t(this,&local_2f8,(tri_idx_list_t *)&local_328);
  boost::shared_ptr<trimesh::dataset_t>::shared_ptr<trimesh::dataset_t>(&local_338,this);
  pmVar11 = (mscomplex_t *)operator_new(400);
  trimesh::mscomplex_t::mscomplex_t(pmVar11);
  boost::shared_ptr<trimesh::mscomplex_t>::shared_ptr<trimesh::mscomplex_t>(&local_348,pmVar11);
  if (local_338.px == (dataset_t *)0x0) {
    pcVar3 = 
    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<trimesh::dataset_t>::operator->() const [T = trimesh::dataset_t]"
    ;
    goto LAB_0014bb23;
  }
  local_260.px = (element_type *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_);
  local_260.pn.pi_ = local_348.pn.pi_;
  if (local_348.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_348.pn.pi_)->use_count_ = (local_348.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  trimesh::dataset_t::work(local_338.px,&local_260);
  boost::detail::shared_count::~shared_count(&local_260.pn);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"gradient done ------------ ",0x1b);
  local_370._M_dataplus._M_p =
       (pointer)boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                          (boost::date_time::c_time::localtime);
  tVar9 = boost::date_time::
          counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
          ::subtract_times((time_rep_type *)&local_370,(time_rep_type *)&local_350);
  poVar10 = std::ostream::_M_insert<double>
                      ((double)((long)tVar9.
                                      super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                      .ticks_.value_ / 1000) / 1000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if ((mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_) != (mscomplex_t *)0x0) {
    trimesh::mscomplex_t::simplify
              ((mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_),0.0,false,0,0);
    if ((mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_) != (mscomplex_t *)0x0) {
      local_270.px = local_338.px;
      local_270.pn.pi_ = local_338.pn.pi_;
      if (local_338.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_338.pn.pi_)->use_count_ = (local_338.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      trimesh::mscomplex_t::collect_mfolds
                ((mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_),&local_270);
      boost::detail::shared_count::~shared_count(&local_270.pn);
      pmVar11 = (mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_);
      if (pmVar11 != (mscomplex_t *)0x0) {
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,local_230._0_8_,
                   (pointer)(local_230._0_8_ + (long)(string *)local_230._8_8_));
        std::__cxx11::string::append((char *)&local_370);
        trimesh::mscomplex_t::save(pmVar11,&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"write unsimplified done -- ",0x1b);
        local_370._M_dataplus._M_p =
             (pointer)boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                                (boost::date_time::c_time::localtime);
        tVar9 = boost::date_time::
                counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
                ::subtract_times((time_rep_type *)&local_370,(time_rep_type *)&local_350);
        poVar10 = std::ostream::_M_insert<double>
                            ((double)((long)tVar9.
                                            super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                            .ticks_.value_ / 1000) / 1000.0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        iVar2 = std::__cxx11::string::compare((char *)&local_250);
        if (iVar2 == 0) {
          if ((mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_) == (mscomplex_t *)0x0)
          goto LAB_0014bb0e;
          trimesh::mscomplex_t::simplify
                    ((mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_),local_300,false,
                     0,0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"simplification done ------ ",0x1b);
        local_370._M_dataplus._M_p =
             (pointer)boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                                (boost::date_time::c_time::localtime);
        tVar9 = boost::date_time::
                counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
                ::subtract_times((time_rep_type *)&local_370,(time_rep_type *)&local_350);
        poVar10 = std::ostream::_M_insert<double>
                            ((double)((long)tVar9.
                                            super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                            .ticks_.value_ / 1000) / 1000.0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if ((mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_) != (mscomplex_t *)0x0) {
          local_280.px = local_338.px;
          local_280.pn.pi_ = local_338.pn.pi_;
          if (local_338.pn.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (local_338.pn.pi_)->use_count_ = (local_338.pn.pi_)->use_count_ + 1;
            UNLOCK();
          }
          trimesh::mscomplex_t::collect_mfolds
                    ((mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_),&local_280);
          boost::detail::shared_count::~shared_count(&local_280.pn);
          pmVar11 = (mscomplex_t *)CONCAT44(local_348.px._4_4_,local_348.px._0_4_);
          if (pmVar11 != (mscomplex_t *)0x0) {
            local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_370,local_230._0_8_,
                       (pointer)(local_230._0_8_ + (long)(string *)local_230._8_8_));
            std::__cxx11::string::append((char *)&local_370);
            trimesh::mscomplex_t::save(pmVar11,&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != &local_370.field_2) {
              operator_delete(local_370._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"write simplified done ---- ",0x1b);
            local_370._M_dataplus._M_p =
                 (pointer)boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                                    (boost::date_time::c_time::localtime);
            tVar9 = boost::date_time::
                    counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
                    ::subtract_times((time_rep_type *)&local_370,(time_rep_type *)&local_350);
            poVar10 = std::ostream::_M_insert<double>
                                ((double)((long)tVar9.
                                                super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                                .ticks_.value_ / 1000) / 1000.0);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"------------------------------------",0x24);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
            std::ostream::put('\0');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"        Finished Processing         ",0x24);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
            std::ostream::put('\0');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"====================================",0x24);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
            std::ostream::put('\0');
            std::ostream::flush();
            boost::detail::shared_count::~shared_count(&local_348.pn);
            boost::detail::shared_count::~shared_count(&local_338.pn);
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
              operator_delete((void *)local_230._0_8_);
            }
            if (local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_328._M_dataplus._M_p);
            }
            iVar2 = 0;
LAB_0014b9f5:
            local_d0._0_8_ = &boost::archive::detail::basic_oarchive::typeinfo;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_60);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(local_90);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)(local_d0 + 0x10));
            std::
            vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
            ::~vector(local_110);
            if (local_138 != (void *)0x0) {
              operator_delete(local_138);
              local_138 = (void *)0x0;
              local_130 = 0;
              local_128 = 0;
              local_120 = 0;
              local_118 = 0;
            }
            std::
            vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
            ::~vector(local_150);
            if (local_178[0] != local_168) {
              operator_delete(local_178[0]);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p);
            }
            return iVar2;
          }
        }
      }
    }
  }
LAB_0014bb0e:
  pcVar3 = 
  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<trimesh::mscomplex_t>::operator->() const [T = trimesh::mscomplex_t]"
  ;
LAB_0014bb23:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,pcVar3);
}

Assistant:

int main(int ac , char **av)
{
  string tri_filename;
  string bin_filename;
  string off_filename;
  string simp_method;

  int    comp_no = 0;
  double simp_tresh  = 0.0;

  bpo::options_description desc("Allowed options");
  desc.add_options()
      ("help,h", "produce help message")
      ("tri-file,t",bpo::value(&tri_filename)->default_value(""),
       "tri file name")
      ("bin-file,b",bpo::value(&bin_filename)->default_value(""),
       "bin file name (function file)")
      ("off-file,o",bpo::value(&off_filename)->default_value(""),
       "off file name")
      ("comp-no,c",bpo::value(&comp_no)->default_value(0),
       "scalar component number to use for the MS compelex")
      ("simp-tresh,s",bpo::value(&simp_tresh)->default_value(0.0),
       "simplification treshold\n"\
       "\n"\
       "====For simp-method = \"P\"=========\n"\
       "if s in [0,1] then simplify all features having pers < s\n"\
       "if s < 0 then simplify till there are int(-s) minima\n"\
       "if s > 1 then simplify till there are int(s)  maxima\n"\
       "\n")
      ("simp-method",bpo::value(&simp_method)->default_value("P"),
       "simplification method to use\n"\
       "P  ----> Persistence\n"\
//       "AWP ---> Area weighted persistence\n"\
//       "ABP ---> Area before persistence"
       );

  bpo::variables_map vm;
  bpo::store(bpo::parse_command_line(ac, av, desc), vm);

  if (vm.count("help"))
  {
    cout << desc << endl;
    return 0;
  }
  try
  {
    bpo::notify(vm);
  }
  catch(bpo::required_option e)
  {
    cout<<e.what()<<endl;
    cout<<desc<<endl;
    return 1;
  }

  if((tri_filename.empty() || bin_filename.empty()) && off_filename.empty())
  {
    cout<<"Must specify either tri-bin or off file"<<endl;
    cout<<desc<<endl;
    return 1;
  }

  utl::timer t;
  t.restart();

  cout<<"===================================="<<endl;
  cout<<"         Starting Processing        "<<endl;
  cout<<"------------------------------------"<<endl;

  trimesh::tri_idx_list_t tlist;
  trimesh::fn_list_t      fns;
  cout<<"selected comp = "<<comp_no<<endl;
  cout<<"------------------------------------"<<endl;

  string fn_pfx;

  if(off_filename.empty())
  {
    print_bin_info(bin_filename);
    read_tri_tlist(tri_filename.c_str(),tlist);
    read_bin_file(fns,bin_filename,comp_no);
    fn_pfx = tri_filename;
  }
  else
  {
    read_off_file(off_filename,fns,tlist,comp_no);
    fn_pfx = off_filename;
  }
  cout<<"data read ---------------- "<<t.elapsed()<<endl;

  trimesh::dataset_ptr_t   ds(new trimesh::dataset_t(fns,tlist));
  trimesh::mscomplex_ptr_t msc(new trimesh::mscomplex_t);
  ds->work(msc);
  cout<<"gradient done ------------ "<<t.elapsed()<<endl;

  msc->simplify(0.0);
  msc->collect_mfolds(ds);

  msc->save(fn_pfx+".mscomplex.full.bin");
  cout<<"write unsimplified done -- "<<t.elapsed()<<endl;


  if( simp_method == "P")
  {
    msc->simplify(simp_tresh);
  }
//  else if (simp_method == "AWP" || simp_method == "ABP")
//  {
//    tri_cc_geom_t::vertex_list_t vlist;

//    if(off_filename.empty())
//      read_tri_vlist(tri_filename.c_str(),vlist);
//    else
//      read_off_vlist(off_filename.c_str(),vlist);

//    tri_cc_geom_ptr_t tcc(new tri_cc_geom_t);
//    tcc->init(ds->m_tcc,vlist);

//    if(simp_method == "AWP")
//      trimesh::simplify_awp(msc,tcc,simp_tresh);
//    else if(simp_method == "ABP")
//      trimesh::simplify_abp(msc,tcc,simp_tresh);

//  }

  cout<<"simplification done ------ "<<t.elapsed()<<endl;

  msc->collect_mfolds(ds);
  msc->save(fn_pfx+".mscomplex.bin");
  cout<<"write simplified done ---- "<<t.elapsed()<<endl;

  cout<<"------------------------------------"<<endl;
  cout<<"        Finished Processing         "<<endl;
  cout<<"===================================="<<endl;
}